

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::MatchExpr<float,_Catch::Matchers::Floating::WithinRelMatcher>::streamReconstructedExpression
          (MatchExpr<float,_Catch::Matchers::Floating::WithinRelMatcher> *this,ostream *os)

{
  __type _Var1;
  ostream *poVar2;
  string matcherAsString;
  string local_30;
  
  Matchers::Impl::MatcherUntypedBase::toString_abi_cxx11_
            ((string *)&matcherAsString,(MatcherUntypedBase *)&this->m_matcher);
  Detail::stringify<float>(&local_30,this->m_arg);
  poVar2 = std::operator<<(os,(string *)&local_30);
  std::operator<<(poVar2,' ');
  std::__cxx11::string::~string((string *)&local_30);
  _Var1 = std::operator==(&matcherAsString,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          Detail::unprintableString_abi_cxx11_);
  if (_Var1) {
    Catch::operator<<((ostream *)os,&this->m_matcherString);
  }
  else {
    std::operator<<(os,(string *)&matcherAsString);
  }
  std::__cxx11::string::~string((string *)&matcherAsString);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            auto matcherAsString = m_matcher.toString();
            os << Catch::Detail::stringify( m_arg ) << ' ';
            if( matcherAsString == Detail::unprintableString )
                os << m_matcherString;
            else
                os << matcherAsString;
        }